

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_decompress_safe_withPrefix64k(char *source,char *dest,int compressedSize,int maxOutputSize)

{
  byte *pbVar1;
  byte *pbVar2;
  char *pcVar3;
  byte bVar4;
  char cVar5;
  ushort uVar6;
  undefined8 uVar7;
  ushort uVar8;
  BYTE *s_1;
  ushort *puVar9;
  ushort *__src;
  ushort *puVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  size_t __n;
  char *pcVar15;
  BYTE *d;
  byte *pbVar16;
  char *pcVar17;
  char *pcVar18;
  ushort *puVar19;
  long lVar20;
  long lVar21;
  BYTE *s;
  byte *pbVar22;
  long lVar23;
  char *pcVar24;
  uint uVar25;
  BYTE *d_3;
  ulong uVar26;
  char *pcVar27;
  ushort *puVar28;
  int local_48;
  
  iVar11 = -1;
  if (-1 < maxOutputSize && source != (char *)0x0) {
    if (maxOutputSize == 0) {
      if (compressedSize == 1) {
        iVar11 = -(uint)(*source != '\0');
      }
    }
    else if (compressedSize != 0) {
      pbVar1 = (byte *)(source + compressedSize);
      uVar14 = (ulong)(uint)maxOutputSize;
      if (0x3f < (uint)maxOutputSize) {
        puVar28 = (ushort *)(pbVar1 + -0xf);
        lVar21 = 0;
        puVar9 = (ushort *)source;
LAB_0014b020:
        do {
          pcVar17 = dest + lVar21;
          __src = (ushort *)((long)puVar9 + 1);
          bVar4 = (byte)*puVar9;
          uVar25 = (uint)bVar4;
          __n = (size_t)(uint)(bVar4 >> 4);
          if (bVar4 >> 4 == 0xf) {
            puVar10 = __src;
            if ((puVar28 <= __src) || (puVar10 = puVar9 + 1, puVar28 < puVar10)) goto LAB_0014b33b;
            uVar26 = (ulong)*(byte *)__src;
            if (uVar26 == 0xff) {
              uVar26 = 0xff;
              puVar9 = puVar10;
              do {
                puVar10 = (ushort *)((long)puVar9 + 1);
                if (puVar28 < puVar10) goto LAB_0014b33b;
                uVar6 = *puVar9;
                uVar26 = uVar26 + (byte)uVar6;
                puVar9 = puVar10;
              } while ((ulong)(byte)uVar6 == 0xff);
              if (uVar26 == 0xffffffffffffffff) goto LAB_0014b33b;
            }
            __n = uVar26 + 0xf;
            puVar19 = (ushort *)((long)puVar10 + __n);
            if ((CARRY8((ulong)pcVar17,__n)) || (CARRY8((ulong)puVar10,__n))) goto LAB_0014b33b;
            lVar20 = __n + lVar21;
            __src = puVar10;
            if (dest + (uVar14 - 0x20) < dest + lVar20) goto LAB_0014b41e;
            if (pbVar1 + -0x20 < puVar19) goto LAB_0014b41e;
            lVar21 = 0;
            do {
              uVar7 = *(undefined8 *)((byte *)((long)puVar10 + lVar21) + 8);
              pcVar3 = pcVar17 + lVar21;
              *(undefined8 *)pcVar3 = *(undefined8 *)((long)puVar10 + lVar21);
              *(undefined8 *)(pcVar3 + 8) = uVar7;
              pbVar16 = (byte *)((long)puVar10 + lVar21 + 0x10);
              uVar7 = *(undefined8 *)(pbVar16 + 8);
              *(undefined8 *)(pcVar3 + 0x10) = *(undefined8 *)pbVar16;
              *(undefined8 *)(pcVar3 + 0x18) = uVar7;
              lVar21 = lVar21 + 0x20;
            } while (pcVar3 + 0x20 < dest + lVar20);
          }
          else {
            if (pbVar1 + -0x11 < __src) goto LAB_0014b41e;
            uVar7 = *(undefined8 *)((long)puVar9 + 9);
            *(undefined8 *)pcVar17 = *(undefined8 *)__src;
            *(undefined8 *)(pcVar17 + 8) = uVar7;
            puVar19 = (ushort *)((long)__src + __n);
            lVar20 = lVar21 + __n;
          }
          pbVar16 = (byte *)(dest + lVar20);
          uVar6 = *puVar19;
          uVar12 = (ulong)uVar6;
          uVar13 = (uint)uVar6;
          puVar9 = puVar19 + 1;
          lVar23 = lVar20 - uVar12;
          pbVar22 = (byte *)(dest + lVar23);
          uVar26 = (ulong)(bVar4 & 0xf);
          if (uVar26 == 0xf) {
            puVar19 = (ushort *)((long)puVar19 + 3);
            puVar10 = puVar19;
            if (pbVar1 + -4 < puVar19) goto LAB_0014b33b;
            uVar26 = (ulong)(byte)*puVar9;
            if (uVar26 == 0xff) {
              uVar26 = 0xff;
              puVar9 = puVar19;
              do {
                puVar19 = (ushort *)((long)puVar9 + 1);
                puVar10 = puVar19;
                if (pbVar1 + -4 < puVar19) goto LAB_0014b33b;
                uVar8 = *puVar9;
                uVar26 = uVar26 + (byte)uVar8;
                puVar9 = puVar19;
              } while ((ulong)(byte)uVar8 == 0xff);
              if (uVar26 == 0xffffffffffffffff) goto LAB_0014b33b;
            }
            uVar26 = uVar26 + 0x13;
            puVar10 = puVar19;
            if (CARRY8((ulong)pbVar16,uVar26)) goto LAB_0014b33b;
            puVar9 = puVar19;
            if (dest + (uVar14 - 0x40) <= pbVar16 + uVar26) goto LAB_0014b4c9;
          }
          else {
            lVar21 = uVar26 + lVar20 + 4;
            uVar26 = uVar26 + 4;
            puVar19 = puVar9;
            if (dest + (uVar14 - 0x40) <= dest + lVar21) goto LAB_0014b4c9;
            if (7 < uVar6) {
              *(undefined8 *)pbVar16 = *(undefined8 *)pbVar22;
              *(undefined8 *)(pbVar16 + 8) = *(undefined8 *)(pbVar22 + 8);
              *(undefined2 *)(pbVar16 + 0x10) = *(undefined2 *)(pbVar22 + 0x10);
              goto LAB_0014b020;
            }
          }
          puVar10 = puVar9;
          if (lVar23 < -0x10000) goto LAB_0014b33b;
          lVar21 = uVar26 + lVar20;
          pbVar2 = (byte *)(dest + lVar21);
          if (uVar6 < 0x10) {
            if (uVar12 == 4) {
              iVar11 = *(int *)pbVar22;
            }
            else if (uVar6 == 2) {
              iVar11 = CONCAT22(*(undefined2 *)pbVar22,*(undefined2 *)pbVar22);
            }
            else {
              if (uVar6 != 1) {
                if (uVar6 < 8) {
                  pbVar16[0] = 0;
                  pbVar16[1] = 0;
                  pbVar16[2] = 0;
                  pbVar16[3] = 0;
                  *pbVar16 = *pbVar22;
                  pbVar16[1] = pbVar22[1];
                  pbVar16[2] = pbVar22[2];
                  pbVar16[3] = pbVar22[3];
                  uVar25 = inc32table[uVar6];
                  *(undefined4 *)(pbVar16 + 4) = *(undefined4 *)(pbVar22 + uVar25);
                  pbVar22 = pbVar22 + ((ulong)uVar25 - (long)dec64table[uVar6]);
                }
                else {
                  *(undefined8 *)pbVar16 = *(undefined8 *)pbVar22;
                  pbVar22 = pbVar22 + 8;
                }
                pbVar16 = pbVar16 + 8;
                do {
                  *(undefined8 *)pbVar16 = *(undefined8 *)pbVar22;
                  pbVar16 = pbVar16 + 8;
                  pbVar22 = pbVar22 + 8;
                } while (pbVar16 < pbVar2);
                goto LAB_0014b020;
              }
              iVar11 = (uint)*pbVar22 * 0x1010101;
            }
            do {
              *(int *)pbVar16 = iVar11;
              *(int *)(pbVar16 + 4) = iVar11;
              pbVar16 = pbVar16 + 8;
            } while (pbVar16 < pbVar2);
            goto LAB_0014b020;
          }
          do {
            uVar7 = *(undefined8 *)(pbVar16 + -uVar12 + 8);
            *(undefined8 *)pbVar16 = *(undefined8 *)(pbVar16 + -uVar12);
            *(undefined8 *)(pbVar16 + 8) = uVar7;
            uVar7 = *(undefined8 *)(pbVar16 + -uVar12 + 0x10 + 8);
            *(undefined8 *)(pbVar16 + 0x10) = *(undefined8 *)(pbVar16 + -uVar12 + 0x10);
            *(undefined8 *)(pbVar16 + 0x18) = uVar7;
            pbVar16 = pbVar16 + 0x20;
          } while (pbVar16 < pbVar2);
        } while( true );
      }
      lVar21 = 0;
      puVar19 = (ushort *)source;
      do {
        while( true ) {
          pcVar17 = dest + lVar21;
          __src = (ushort *)((long)puVar19 + 1);
          uVar25 = (uint)(byte)*puVar19;
          uVar13 = (uint)(byte)((byte)*puVar19 >> 4);
          __n = (size_t)uVar13;
          if (uVar13 == 0xf) break;
          if ((source + (long)compressedSize + -0x10 <= __src) || (dest + (uVar14 - 0x20) < pcVar17)
             ) goto LAB_0014b41e;
          uVar7 = *(undefined8 *)((long)puVar19 + 9);
          *(undefined8 *)pcVar17 = *(undefined8 *)__src;
          *(undefined8 *)(pcVar17 + 8) = uVar7;
          lVar20 = lVar21 + __n;
          uVar26 = (ulong)(uVar25 & 0xf);
          puVar19 = (ushort *)((long)__src + __n) + 1;
          uVar6 = *(ushort *)((long)__src + __n);
          uVar13 = (uint)uVar6;
          lVar23 = lVar20 - (ulong)uVar6;
          if ((uVar26 == 0xf) || (uVar6 < 8)) goto LAB_0014b46e;
          *(undefined8 *)(dest + lVar20) = *(undefined8 *)(dest + lVar23);
          *(undefined8 *)(dest + lVar20 + 8) = *(undefined8 *)(dest + lVar23 + 8);
          *(undefined2 *)(dest + lVar20 + 0x10) = *(undefined2 *)(dest + lVar23 + 0x10);
          lVar21 = lVar20 + uVar26 + 4;
        }
        puVar28 = (ushort *)(pbVar1 + -0xf);
        puVar10 = __src;
        if ((puVar28 <= __src) || (puVar10 = puVar19 + 1, puVar28 < puVar10)) goto LAB_0014b33b;
        uVar26 = (ulong)*(byte *)__src;
        if (uVar26 == 0xff) {
          uVar26 = 0xff;
          do {
            puVar9 = puVar10;
            puVar10 = (ushort *)((long)puVar9 + 1);
            if (puVar28 < puVar10) goto LAB_0014b64f;
            uVar26 = uVar26 + (byte)*puVar9;
          } while ((ulong)(byte)*puVar9 == 0xff);
          if (uVar26 == 0xffffffffffffffff) {
LAB_0014b64f:
            puVar10 = (ushort *)((long)puVar9 + 1);
LAB_0014b33b:
            local_48 = (int)source;
            return ~(uint)puVar10 + local_48;
          }
        }
        __n = uVar26 + 0xf;
        if ((CARRY8((ulong)pcVar17,__n)) || (__src = puVar10, CARRY8((ulong)puVar10,__n)))
        goto LAB_0014b33b;
LAB_0014b41e:
        pcVar17 = dest + lVar21;
        lVar20 = lVar21 + __n;
        if ((dest + (uVar14 - 0xc) < dest + lVar20) ||
           (puVar28 = (ushort *)((long)__src + __n), pbVar1 + -8 < puVar28)) {
          puVar10 = __src;
          if (((byte *)((long)__src + __n) == pbVar1) && (lVar20 <= (long)uVar14)) {
            memmove(pcVar17,__src,__n);
            return (int)lVar20;
          }
          goto LAB_0014b33b;
        }
        do {
          *(undefined8 *)pcVar17 = *(undefined8 *)__src;
          pcVar17 = pcVar17 + 8;
          __src = __src + 4;
        } while (pcVar17 < dest + lVar20);
        uVar13 = (uint)*puVar28;
        puVar19 = puVar28 + 1;
        lVar23 = lVar20 - (ulong)*puVar28;
        uVar26 = (ulong)(uVar25 & 0xf);
LAB_0014b46e:
        puVar10 = puVar19;
        if ((int)uVar26 == 0xf) {
          puVar10 = (ushort *)((long)puVar19 + 1);
          if (pbVar1 + -4 < puVar10) goto LAB_0014b33b;
          uVar12 = (ulong)(byte)*puVar19;
          if (uVar12 == 0xff) {
            uVar12 = 0xff;
            puVar28 = puVar10;
            do {
              puVar10 = (ushort *)((long)puVar28 + 1);
              if (pbVar1 + -4 < puVar10) {
                puVar10 = (ushort *)((long)puVar28 + 1);
                goto LAB_0014b33b;
              }
              uVar6 = *puVar28;
              uVar12 = uVar12 + (byte)uVar6;
              puVar28 = puVar10;
            } while ((ulong)(byte)uVar6 == 0xff);
          }
          uVar26 = uVar12 + 0xf;
          if ((uVar12 == 0xffffffffffffffff) || (CARRY8((ulong)(dest + lVar20),uVar26)))
          goto LAB_0014b33b;
        }
        uVar26 = uVar26 + 4;
        puVar19 = puVar10;
LAB_0014b4c9:
        puVar10 = puVar19;
        if (lVar23 < -0x10000) goto LAB_0014b33b;
        pcVar17 = dest + lVar20;
        pcVar24 = dest + lVar23;
        lVar21 = lVar20 + uVar26;
        pcVar3 = dest + lVar21;
        if (uVar13 < 8) {
          pcVar17[0] = '\0';
          pcVar17[1] = '\0';
          pcVar17[2] = '\0';
          pcVar17[3] = '\0';
          *pcVar17 = *pcVar24;
          pcVar17[1] = pcVar24[1];
          pcVar17[2] = pcVar24[2];
          pcVar17[3] = pcVar24[3];
          uVar12 = (ulong)*(uint *)((long)inc32table + (ulong)(uVar13 << 2));
          *(undefined4 *)(pcVar17 + 4) = *(undefined4 *)(pcVar24 + uVar12);
          pcVar24 = pcVar24 + (uVar12 - (long)*(int *)((long)dec64table + (ulong)(uVar13 << 2)));
        }
        else {
          *(undefined8 *)pcVar17 = *(undefined8 *)pcVar24;
          pcVar24 = pcVar24 + 8;
        }
        pcVar15 = pcVar17 + 8;
        if (dest + (uVar14 - 0xc) < pcVar3) {
          if (dest + (uVar14 - 5) < pcVar3) goto LAB_0014b33b;
          pcVar17 = dest + (uVar14 - 7);
          pcVar18 = pcVar24;
          pcVar27 = pcVar15;
          if (pcVar15 < pcVar17) {
            do {
              *(undefined8 *)pcVar27 = *(undefined8 *)pcVar18;
              pcVar27 = pcVar27 + 8;
              pcVar18 = pcVar18 + 8;
            } while (pcVar27 < pcVar17);
            pcVar24 = pcVar24 + ((long)pcVar17 - (long)pcVar15);
            pcVar15 = pcVar17;
          }
          for (; pcVar15 < pcVar3; pcVar15 = pcVar15 + 1) {
            cVar5 = *pcVar24;
            pcVar24 = pcVar24 + 1;
            *pcVar15 = cVar5;
          }
        }
        else {
          *(undefined8 *)pcVar15 = *(undefined8 *)pcVar24;
          if (0x10 < uVar26) {
            pcVar17 = pcVar17 + 0x10;
            do {
              pcVar24 = pcVar24 + 8;
              *(undefined8 *)pcVar17 = *(undefined8 *)pcVar24;
              pcVar17 = pcVar17 + 8;
            } while (pcVar17 < pcVar3);
          }
        }
      } while( true );
    }
  }
  return iVar11;
}

Assistant:

LZ4_FORCE_O2 /* Exported, an obsolete API function. */
int LZ4_decompress_safe_withPrefix64k(const char* source, char* dest, int compressedSize, int maxOutputSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxOutputSize,
                                  decode_full_block, withPrefix64k,
                                  (BYTE*)dest - 64 KB, NULL, 0);
}